

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

string * __thiscall
pbrt::SPPMIntegrator::ToString_abi_cxx11_(string *__return_storage_ptr__,SPPMIntegrator *this)

{
  RGBColorSpace *in_stack_fffffffffffffff0;
  
  StringPrintf<pbrt::CameraHandle_const&,float_const&,int_const&,int_const&,int_const&,bool_const&,pbrt::RGBColorSpace_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ SPPMIntegrator camera: %s initialSearchRadius: %f nIterations: %d maxDepth: %d photonsPerIteration: %d regularize: %s colorSpace: %s digitPermutations:(elided) ]"
             ,(char *)&this->camera,(CameraHandle *)&this->initialSearchRadius,
             (float *)&this->nIterations,&this->maxDepth,&this->photonsPerIteration,
             (int *)&this->regularize,(bool *)this->colorSpace,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string SPPMIntegrator::ToString() const {
    return StringPrintf("[ SPPMIntegrator camera: %s initialSearchRadius: %f "
                        "nIterations: %d maxDepth: %d photonsPerIteration: %d "
                        "regularize: %s colorSpace: %s digitPermutations:(elided) ]",
                        camera, initialSearchRadius, nIterations, maxDepth,
                        photonsPerIteration, regularize, *colorSpace);
}